

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_user_domains.cc
# Opt level: O2

int __thiscall
aliyun::Cdn::DescribeUserDomains
          (Cdn *this,CdnDescribeUserDomainsRequestType *req,
          CdnDescribeUserDomainsResponseType *response,CdnErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  allocator<char> local_4e4;
  allocator<char> local_4e3;
  allocator<char> local_4e2;
  allocator<char> local_4e1;
  Value val;
  undefined1 local_4c0 [32];
  _Alloc_hider local_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  _Alloc_hider local_480;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_440;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420;
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  string str_response;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeUserDomains",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OwnerId",(allocator<char> *)local_4c0);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"ResourceOwnerAccount",(allocator<char> *)local_4c0);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ResourceOwnerId",(allocator<char> *)local_4c0);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->page_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"PageSize",(allocator<char> *)local_4c0);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->page_number)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"PageNumber",(allocator<char> *)local_4c0);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"RegionId",(allocator<char> *)local_4c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (CdnErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c0,anon_var_dwarf_df3b2 + 9,&local_4e1);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_4c0);
        std::__cxx11::string::~string((string *)local_4c0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c0,anon_var_dwarf_df3b2 + 9,&local_4e2);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_4c0);
        std::__cxx11::string::~string((string *)local_4c0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c0,anon_var_dwarf_df3b2 + 9,&local_4e3);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_4c0);
        std::__cxx11::string::~string((string *)local_4c0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_4c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c0,anon_var_dwarf_df3b2 + 9,&local_4e4);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_4c0);
        std::__cxx11::string::~string((string *)local_4c0);
      }
      if (response != (CdnDescribeUserDomainsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"PageNumber");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageNumber");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_number = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageSize");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageSize");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_size = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"TotalCount");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TotalCount");
          IVar3 = Json::Value::asInt(pVVar5);
          response->total_count = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Domains");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Domains");
          bVar1 = Json::Value::isMember(pVVar5,"PageData");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"Domains");
            pVVar5 = Json::Value::operator[](pVVar5,"PageData");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (index = 0; AVar4 = Json::Value::size(pVVar5), index < AVar4; index = index + 1) {
                local_4c0._0_8_ = local_4c0 + 0x10;
                local_4c0._8_8_ = 0;
                local_4c0[0x10] = '\0';
                local_4a0._M_p = (pointer)&local_490;
                local_498 = 0;
                local_490._M_local_buf[0] = '\0';
                local_480._M_p = (pointer)&local_470;
                local_478 = 0;
                local_470._M_local_buf[0] = '\0';
                local_460._M_p = (pointer)&local_450;
                local_458 = 0;
                local_450._M_local_buf[0] = '\0';
                local_440._M_p = (pointer)&local_430;
                local_438 = 0;
                local_430._M_local_buf[0] = '\0';
                local_420._M_p = (pointer)&local_410;
                local_418 = 0;
                local_410._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"DomainName");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"DomainName");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Cname");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Cname");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_4a0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"CdnType");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"CdnType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_480,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"DomainStatus");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"DomainStatus");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_460,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"GmtCreated");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"GmtCreated");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_440,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"GmtModified");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"GmtModified");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_420,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                std::
                vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
                ::push_back(&response->domains,(value_type *)local_4c0);
                CdnDescribeUserDomainsPageDataType::~CdnDescribeUserDomainsPageDataType
                          ((CdnDescribeUserDomainsPageDataType *)local_4c0);
              }
            }
          }
        }
      }
      goto LAB_00131efc;
    }
  }
  iVar2 = -1;
  if (error_info != (CdnErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00131efc:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Cdn::DescribeUserDomains(const CdnDescribeUserDomainsRequestType& req,
                      CdnDescribeUserDomainsResponseType* response,
                       CdnErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeUserDomains");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}